

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoted.c
# Opt level: O1

Denoted * get_denoted_struct_union(token *id,Struct_Union *struct_union)

{
  Denoted *pDVar1;
  
  pDVar1 = (Denoted *)malloc(0x18);
  pDVar1->denotation = DT_Struct_Union_Tag;
  *(token **)(pDVar1 + 2) = id;
  *(Struct_Union **)(pDVar1 + 4) = struct_union;
  return pDVar1;
}

Assistant:

struct Denoted* get_denoted_struct_union(struct token *id,struct Struct_Union *struct_union)
{
	struct Denoted_Struct_Union *ret;
	ret=malloc(sizeof(struct Denoted_Struct_Union));
	ret->denotation=DT_Struct_Union_Tag;
	ret->id=id;
	ret->struct_union=struct_union;

	return (struct Denoted*)ret;
}